

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collider.cxx
# Opt level: O3

NucleusPtr __thiscall
glauber::anon_unknown_6::create_nucleus(anon_unknown_6 *this,VarMap *var_map,size_t index)

{
  pointer pbVar1;
  any *paVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  double *pdVar4;
  NucleusPtr NVar5;
  undefined8 uVar6;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"projectile","");
  paVar2 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pvVar3 = boost::
           any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                     (paVar2);
  pbVar1 = (pvVar3->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (index < (ulong)((long)(pvVar3->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"nucleon-width","");
    paVar2 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
    pdVar4 = boost::any_cast<double_const&>(paVar2);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    NVar5 = Nucleus::create((Nucleus *)this,pbVar1 + index,*pdVar4);
    return (NucleusPtr)
           NVar5._M_t.
           super___uniq_ptr_impl<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>._M_t.
           super__Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>.
           super__Head_base<0UL,_glauber::Nucleus_*,_false>._M_head_impl;
  }
  uVar6 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     index);
  _Unwind_Resume(uVar6);
}

Assistant:

NucleusPtr create_nucleus(const VarMap& var_map, std::size_t index) {
  const auto& species = var_map["projectile"]
                        .as<std::vector<std::string>>().at(index);
  const auto& nucleon_width = var_map["nucleon-width"] .as<double>();
  return Nucleus::create(species, nucleon_width);
}